

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<kj::Own<capnp::ClientHook>_>::fork(Promise<kj::Own<capnp::ClientHook>_> *this)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::_::PromiseNode> *in_RSI;
  Own<kj::_::ForkHub<kj::Own<capnp::ClientHook>_>_> local_28;
  Promise<kj::Own<capnp::ClientHook>_> *this_local;
  
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>(in_RSI);
  refcounted<kj::_::ForkHub<kj::Own<capnp::ClientHook>>,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_28,params);
  ForkedPromise<kj::Own<capnp::ClientHook>_>::ForkedPromise
            ((ForkedPromise<kj::Own<capnp::ClientHook>_> *)this,false,&local_28);
  Own<kj::_::ForkHub<kj::Own<capnp::ClientHook>_>_>::~Own(&local_28);
  return (__pid_t)this;
}

Assistant:

ForkedPromise<T> Promise<T>::fork() {
  return ForkedPromise<T>(false, refcounted<_::ForkHub<_::FixVoid<T>>>(kj::mv(node)));
}